

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O0

void sum_final(mtree_writer *mtree,reg_info *reg)

{
  ulong local_20;
  uint64_t len;
  reg_info *reg_local;
  mtree_writer *mtree_local;
  
  if ((mtree->compute_sum & 1U) != 0) {
    for (local_20 = mtree->crc_len; local_20 != 0; local_20 = local_20 >> 8) {
      mtree->crc = mtree->crc << 8 ^ crctab[(ulong)(mtree->crc >> 0x18) ^ local_20 & 0xff];
    }
    reg->crc = mtree->crc ^ 0xffffffff;
  }
  if ((mtree->compute_sum & 0x100U) != 0) {
    __archive_openssl_md5final(&mtree->md5ctx,reg->buf_md5);
  }
  if ((mtree->compute_sum & 0x2000U) != 0) {
    __archive_openssl_ripemd160final(&mtree->rmd160ctx,reg->buf_rmd160);
  }
  if ((mtree->compute_sum & 0x4000U) != 0) {
    __archive_openssl_sha1final(&mtree->sha1ctx,reg->buf_sha1);
  }
  if ((mtree->compute_sum & 0x800000U) != 0) {
    __archive_openssl_sha256final(&mtree->sha256ctx,reg->buf_sha256);
  }
  if ((mtree->compute_sum & 0x1000000U) != 0) {
    __archive_openssl_sha384final(&mtree->sha384ctx,reg->buf_sha384);
  }
  if ((mtree->compute_sum & 0x2000000U) != 0) {
    __archive_openssl_sha512final(&mtree->sha512ctx,reg->buf_sha512);
  }
  reg->compute_sum = mtree->compute_sum;
  return;
}

Assistant:

static void
sum_final(struct mtree_writer *mtree, struct reg_info *reg)
{

	if (mtree->compute_sum & F_CKSUM) {
		uint64_t len;
		/* Include the length of the file. */
		for (len = mtree->crc_len; len != 0; len >>= 8)
			COMPUTE_CRC(mtree->crc, len & 0xff);
		reg->crc = ~mtree->crc;
	}
#ifdef ARCHIVE_HAS_MD5
	if (mtree->compute_sum & F_MD5)
		archive_md5_final(&mtree->md5ctx, reg->buf_md5);
#endif
#ifdef ARCHIVE_HAS_RMD160
	if (mtree->compute_sum & F_RMD160)
		archive_rmd160_final(&mtree->rmd160ctx, reg->buf_rmd160);
#endif
#ifdef ARCHIVE_HAS_SHA1
	if (mtree->compute_sum & F_SHA1)
		archive_sha1_final(&mtree->sha1ctx, reg->buf_sha1);
#endif
#ifdef ARCHIVE_HAS_SHA256
	if (mtree->compute_sum & F_SHA256)
		archive_sha256_final(&mtree->sha256ctx, reg->buf_sha256);
#endif
#ifdef ARCHIVE_HAS_SHA384
	if (mtree->compute_sum & F_SHA384)
		archive_sha384_final(&mtree->sha384ctx, reg->buf_sha384);
#endif
#ifdef ARCHIVE_HAS_SHA512
	if (mtree->compute_sum & F_SHA512)
		archive_sha512_final(&mtree->sha512ctx, reg->buf_sha512);
#endif
	/* Save what types of sum are computed. */
	reg->compute_sum = mtree->compute_sum;
}